

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void rtc::LogMessage::RemoveLogToStream(LogSink *stream)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator local_30;
  _Self local_28;
  _Self local_20;
  iterator it;
  CritScope cs;
  LogSink *stream_local;
  
  CritScope::CritScope((CritScope *)&it,(CriticalSection *)(anonymous_namespace)::g_log_crit);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
       ::begin((list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
                *)streams__abi_cxx11_);
  do {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
         ::end((list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
                *)streams__abi_cxx11_);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
LAB_001be18c:
      UpdateMinLogSeverity();
      CritScope::~CritScope((CritScope *)&it);
      return;
    }
    ppVar2 = std::_List_iterator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>::operator->
                       (&local_20);
    if (stream == ppVar2->first) {
      std::_List_const_iterator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>::
      _List_const_iterator(&local_30,&local_20);
      std::__cxx11::
      list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
      ::erase((list<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>,_std::allocator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>_>
               *)streams__abi_cxx11_,local_30);
      goto LAB_001be18c;
    }
    std::_List_iterator<std::pair<rtc::LogSink_*,_rtc::LoggingSeverity>_>::operator++(&local_20);
  } while( true );
}

Assistant:

void LogMessage::RemoveLogToStream(LogSink* stream) {
  CritScope cs(&g_log_crit);
  for (StreamList::iterator it = streams_.begin(); it != streams_.end(); ++it) {
    if (stream == it->first) {
      streams_.erase(it);
      break;
    }
  }
  UpdateMinLogSeverity();
}